

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_GEOM pRVar2;
  REF_CELL ref_cell;
  REF_DBL *pRVar3;
  FILE *pFVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *__s;
  int *piVar7;
  long lVar8;
  REF_INT *pRVar9;
  long lVar10;
  undefined8 uVar11;
  REF_INT RVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  REF_DICT ref_dict;
  REF_DBL ks;
  REF_DBL kr;
  REF_INT local;
  REF_INT nodes [27];
  REF_DICT local_128;
  FILE *local_120;
  ulong local_118;
  REF_DBL local_110;
  REF_DBL local_108;
  uint local_100;
  int local_fc;
  REF_GRID local_f8;
  long local_f0;
  REF_DBL local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  REF_DBL local_c8 [3];
  REF_NODE local_b0;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->geom;
  local_f8 = ref_grid;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe35,
           "ref_geom_curve_tec","unable to open file");
    RVar6 = 2;
  }
  else {
    fwrite("title=\"refine cad coupling in tecplot format\"\n",0x2e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" \"ks\" \"sx\" \"sy\" \"sz\"\n"
           ,0x40,1,__s);
    lVar8 = (long)pRVar2->max;
    if (0 < lVar8) {
      pRVar9 = pRVar2->descr;
      uVar15 = 0x7fffffff;
      uVar5 = 0x80000000;
      lVar10 = 0;
      do {
        if (*(int *)((long)pRVar9 + lVar10) == 2) {
          uVar1 = *(uint *)((long)pRVar9 + lVar10 + 4);
          if ((int)uVar1 <= (int)uVar15) {
            uVar15 = uVar1;
          }
          if ((int)uVar5 <= (int)uVar1) {
            uVar5 = uVar1;
          }
        }
        lVar10 = lVar10 + 0x18;
      } while (lVar8 * 0x18 != lVar10);
      pFVar4 = __s;
      if ((int)uVar15 <= (int)uVar5) {
        do {
          local_120 = pFVar4;
          local_b0 = local_f8->node;
          ref_cell = local_f8->cell[3];
          pRVar2 = local_f8->geom;
          local_108 = 0.0;
          local_e8 = 0.0;
          uStack_e0 = 0;
          local_d8 = 0;
          local_110 = 0.0;
          local_c8[0] = 0.0;
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          local_100 = uVar5;
          uVar5 = ref_dict_create(&local_128);
          if (uVar5 != 0) {
            pcVar13 = "create dict";
            uVar11 = 0xdb4;
            goto LAB_00165496;
          }
          iVar14 = pRVar2->max;
          if (0 < iVar14) {
            lVar10 = 0;
            lVar8 = 0;
            do {
              pRVar9 = pRVar2->descr;
              if ((*(int *)((long)pRVar9 + lVar10) == 2) &&
                 (*(uint *)((long)pRVar9 + lVar10 + 4) == uVar15)) {
                uVar5 = ref_dict_store(local_128,*(REF_INT *)((long)pRVar9 + lVar10 + 0x14),
                                       (REF_INT)lVar8);
                if (uVar5 != 0) {
                  pcVar13 = "mark nodes";
                  uVar11 = 0xdb9;
                  goto LAB_00165496;
                }
                iVar14 = pRVar2->max;
              }
              lVar8 = lVar8 + 1;
              lVar10 = lVar10 + 0x18;
            } while (lVar8 < iVar14);
          }
          if (ref_cell->max < 1) {
LAB_001652a9:
            uVar5 = ref_dict_free(local_128);
            __s = local_120;
            if (uVar5 != 0) {
              pcVar13 = "free dict";
              uVar11 = 0xdc7;
LAB_00165496:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,uVar11,"ref_geom_curve_tec_zone",(ulong)uVar5,pcVar13);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xe44,"ref_geom_curve_tec",(ulong)uVar5,"tec face");
              return uVar5;
            }
          }
          else {
            local_118 = CONCAT44(local_118._4_4_,local_128->n);
            RVar12 = 0;
            uVar5 = 0;
            do {
              RVar6 = ref_cell_nodes(ref_cell,RVar12,local_a8);
              uVar5 = uVar5 + (local_a8[3] == uVar15 && RVar6 == 0);
              RVar12 = RVar12 + 1;
            } while (RVar12 < ref_cell->max);
            if (((int)local_118 == 0) || (uVar5 == 0)) goto LAB_001652a9;
            fprintf(local_120,
                    "zone t=\"curve%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)uVar15,local_118 & 0xffffffff,(ulong)uVar5,"point","fetriangle");
            __s = local_120;
            if (0 < local_128->n) {
              piVar7 = local_128->key;
              pRVar9 = local_128->value;
              local_f0 = 4;
              local_118 = 1;
              while( true ) {
                lVar8 = (long)*piVar7;
                RVar12 = *pRVar9;
                if ((pRVar2->model != (void *)0x0) &&
                   (uVar5 = ref_egads_face_curvature
                                      (pRVar2,RVar12,&local_108,&local_e8,&local_110,local_c8),
                   uVar5 != 0)) {
                  pcVar13 = "curve";
                  uVar11 = 0xdd2;
                  goto LAB_00165496;
                }
                if ((pRVar2->meshlink != (void *)0x0) &&
                   (uVar5 = ref_meshlink_face_curvature
                                      (local_f8,RVar12,&local_108,&local_e8,&local_110,local_c8),
                   uVar5 != 0)) {
                  pcVar13 = "curve";
                  uVar11 = 0xdd5;
                  goto LAB_00165496;
                }
                __s = local_120;
                pRVar3 = local_b0->real;
                fprintf(local_120,
                        " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                        SUB84(pRVar3[lVar8 * 0xf],0),pRVar3[lVar8 * 0xf + 1],pRVar3[lVar8 * 0xf + 2]
                        ,local_108,local_e8,uStack_e0,local_d8,local_110);
                if ((long)local_128->n <= (long)local_118) break;
                piVar7 = (int *)((long)local_128->key + local_f0);
                pRVar9 = (REF_INT *)(local_f0 + (long)local_128->value);
                local_118 = local_118 + 1;
                local_f0 = local_f0 + 4;
              }
            }
            if (0 < ref_cell->max) {
              iVar14 = 0;
              do {
                RVar6 = ref_cell_nodes(ref_cell,iVar14,local_a8);
                if ((RVar6 == 0) && (local_a8[3] == uVar15)) {
                  lVar8 = 0;
                  do {
                    uVar5 = ref_dict_location(local_128,local_a8[lVar8],&local_fc);
                    if (uVar5 != 0) {
                      pcVar13 = "localize";
                      uVar11 = 0xde2;
                      goto LAB_00165496;
                    }
                    fprintf(__s," %d",(ulong)(local_fc + 1));
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 3);
                  fputc(10,__s);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < ref_cell->max);
            }
            uVar5 = ref_dict_free(local_128);
            if (uVar5 != 0) {
              pcVar13 = "free dict";
              uVar11 = 0xde9;
              goto LAB_00165496;
            }
          }
          bVar16 = uVar15 != local_100;
          uVar15 = uVar15 + 1;
          uVar5 = local_100;
          pFVar4 = local_120;
        } while (bVar16);
      }
    }
    fclose(__s);
    RVar6 = 0;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(file,
          "variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" "
          "\"ks\" \"sx\" \"sy\" \"sz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_curve_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}